

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

String * __thiscall
Rml::StringUtilities::ToUTF8_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,Character *characters,
          int num_characters)

{
  byte local_9c;
  byte local_9b;
  byte local_9a;
  byte local_99;
  byte *local_98;
  undefined8 local_90;
  byte local_83;
  byte local_82;
  byte local_81;
  byte *local_80;
  undefined8 local_78;
  byte local_6a;
  byte local_69;
  byte *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  int h4;
  int h3;
  int h2;
  int h1;
  int l6;
  int l5;
  int l4;
  int l3;
  char32_t c;
  int i;
  bool invalid_character;
  undefined1 local_1d;
  int local_1c;
  StringUtilities *pSStack_18;
  int num_characters_local;
  Character *characters_local;
  String *result;
  
  local_1c = (int)characters;
  local_1d = 0;
  pSStack_18 = this;
  characters_local = (Character *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  c._3_1_ = 0;
  for (l3 = 0; l3 < local_1c; l3 = l3 + 1) {
    l4 = *(int *)(pSStack_18 + (long)l3 * 4);
    l5 = 7;
    l6 = 0xf;
    h1 = 0x1f;
    h2 = 0x3f;
    h3 = 0x80;
    h4 = 0xc0;
    local_54 = 0xe0;
    local_58 = 0xf0;
    if ((uint)l4 < 0x80) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(byte)l4);
    }
    else if ((uint)l4 < 0x800) {
      local_6a = (byte)((uint)l4 >> 6) & 0x1f | 0xc0;
      local_69 = (byte)l4 & 0x3f | 0x80;
      local_68 = &local_6a;
      local_60 = 2;
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_68,2);
    }
    else if ((uint)l4 < 0x10000) {
      local_83 = (byte)((uint)l4 >> 0xc) & 0xf | 0xe0;
      local_82 = (byte)((uint)l4 >> 6) & 0x3f | 0x80;
      local_81 = (byte)l4 & 0x3f | 0x80;
      local_80 = &local_83;
      local_78 = 3;
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80,3);
    }
    else if ((uint)l4 < 0x110000) {
      local_9c = (byte)((uint)l4 >> 0x12) & 7 | 0xf0;
      local_9b = (byte)((uint)l4 >> 0xc) & 0x3f | 0x80;
      local_9a = (byte)((uint)l4 >> 6) & 0x3f | 0x80;
      local_99 = (byte)l4 & 0x3f | 0x80;
      local_98 = &local_9c;
      local_90 = 4;
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_98,4);
    }
    else {
      c._3_1_ = 1;
    }
  }
  if ((c._3_1_ & 1) != 0) {
    Log::Message(LT_WARNING,"One or more invalid code points encountered while encoding to UTF-8.");
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::ToUTF8(const Character* characters, int num_characters)
{
	String result;
	result.reserve(num_characters);

	bool invalid_character = false;

	for (int i = 0; i < num_characters; i++)
	{
		char32_t c = (char32_t)characters[i];

		constexpr int l3 = 0b0000'0111;
		constexpr int l4 = 0b0000'1111;
		constexpr int l5 = 0b0001'1111;
		constexpr int l6 = 0b0011'1111;
		constexpr int h1 = 0b1000'0000;
		constexpr int h2 = 0b1100'0000;
		constexpr int h3 = 0b1110'0000;
		constexpr int h4 = 0b1111'0000;

		if (c < 0x80)
			result += (char)c;
		else if (c < 0x800)
			result += {char(((c >> 6) & l5) | h2), char((c & l6) | h1)};
		else if (c < 0x10000)
			result += {char(((c >> 12) & l4) | h3), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else if (c <= 0x10FFFF)
			result += {char(((c >> 18) & l3) | h4), char(((c >> 12) & l6) | h1), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else
			invalid_character = true;
	}

	if (invalid_character)
		Log::Message(Log::LT_WARNING, "One or more invalid code points encountered while encoding to UTF-8.");

	return result;
}